

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O3

void picosha2::impl::
     hash256_impl<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_char*>
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      last,long first2,long last2)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  word_t *pwVar5;
  ulong uVar6;
  undefined1 auStack_98 [8];
  hash256_one_by_one hasher;
  
  hasher.data_length_digits_[0] = 0;
  hasher.data_length_digits_[1] = 0;
  hasher.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hasher.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  hasher.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hasher.data_length_digits_[2] = 0;
  hasher.data_length_digits_[3] = 0x6a09e667;
  hasher.h_[0] = 0xbb67ae85;
  hasher.h_[1] = 0x3c6ef372;
  hasher.h_[2] = 0xa54ff53a;
  hasher.h_[3] = 0x510e527f;
  hasher.h_[4] = 0x9b05688c;
  hasher.h_[5] = 0x1f83d9ab;
  hasher.h_[6] = 0x5be0cd19;
  hash256_one_by_one::process<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((hash256_one_by_one *)auStack_98,first,last);
  hash256_one_by_one::finish((hash256_one_by_one *)auStack_98);
  pwVar5 = hasher.data_length_digits_ + 3;
  lVar3 = 0x38;
  do {
    if (first2 != last2) {
      bVar4 = 0x18;
      uVar6 = 0;
      do {
        *(char *)(first2 + uVar6) = (char)(*pwVar5 >> (bVar4 & 0x3f));
        uVar1 = uVar6 + 1;
        if (2 < uVar6) break;
        lVar2 = first2 + uVar6;
        bVar4 = bVar4 - 8;
        uVar6 = uVar1;
      } while (lVar2 + 1 != last2);
      first2 = first2 + uVar1;
    }
    pwVar5 = (word_t *)((long)hasher.data_length_digits_ + lVar3 + -0x18);
    lVar3 = lVar3 + 8;
    if (lVar3 == 0x78) {
      if (auStack_98 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_98);
      }
      return;
    }
  } while( true );
}

Assistant:

void hash256_impl(RaIter first, RaIter last, OutIter first2, OutIter last2, int,
                  std::random_access_iterator_tag) {
    hash256_one_by_one hasher;
    // hasher.init();
    hasher.process(first, last);
    hasher.finish();
    hasher.get_hash_bytes(first2, last2);
}